

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O3

bool Js::SIMDBool32x4Operation::OpAllTrue<int>(SIMDValue *simd)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)((simd->field_0).i32[0] == 0);
  auVar2._4_4_ = -(uint)((simd->field_0).i32[1] == 0);
  auVar2._8_4_ = -(uint)((simd->field_0).i32[2] == 0);
  auVar2._12_4_ = -(uint)((simd->field_0).i32[3] == 0);
  iVar1 = movmskps(in_EAX,auVar2);
  return iVar1 == 0;
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }